

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_eliminate_unused_globals(REF_NODE ref_node)

{
  REF_MPI ref_mpi;
  REF_INT RVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  REF_INT *counts;
  REF_INT *counts_00;
  ulong uVar5;
  long lVar6;
  REF_GLOB *sorts;
  REF_INT chunk;
  long lVar7;
  undefined8 uVar8;
  ulong uVar9;
  REF_STATUS RVar10;
  char *pcVar11;
  size_t __size;
  REF_INT active1;
  ulong local_50;
  REF_INT *local_48;
  long local_40;
  REF_INT nactive;
  
  ref_mpi = ref_node->ref_mpi;
  uVar2 = ref_sort_in_place_glob(ref_node->n_unused,ref_node->unused_global);
  if (uVar2 == 0) {
    if ((long)ref_mpi->n < 0) {
      pcVar11 = "malloc counts of REF_INT negative";
      uVar8 = 0x27f;
LAB_0018242f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
             "ref_node_eliminate_unused_globals",pcVar11);
      return 1;
    }
    __size = (long)ref_mpi->n << 2;
    counts = (REF_INT *)malloc(__size);
    if (counts == (REF_INT *)0x0) {
      pcVar11 = "malloc counts of REF_INT NULL";
      uVar8 = 0x27f;
    }
    else {
      counts_00 = (REF_INT *)malloc(__size);
      if (counts_00 != (REF_INT *)0x0) {
        uVar2 = ref_mpi_allgather(ref_mpi,&ref_node->n_unused,counts,1);
        if (uVar2 == 0) {
          uVar2 = ref_mpi->n;
          uVar5 = 0;
          uVar9 = 0;
          if (0 < (int)uVar2) {
            uVar9 = (ulong)uVar2;
          }
          local_40 = 0;
          for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
            local_40 = local_40 + counts[uVar5];
          }
          iVar3 = (int)(local_40 / (long)(int)uVar2) + 1;
          chunk = 100000;
          if (100000 < iVar3) {
            chunk = iVar3;
          }
          uVar5 = 0;
          local_48 = &ref_node->n_unused;
          while( true ) {
            if ((int)uVar2 <= (REF_INT)uVar5) {
              uVar9 = 0;
              uVar5 = (ulong)(uint)ref_node->n;
              if (ref_node->n < 1) {
                uVar5 = uVar9;
              }
              for (; uVar5 != uVar9; uVar9 = uVar9 + 1) {
                ref_node->global[ref_node->sorted_local[uVar9]] = ref_node->sorted_global[uVar9];
              }
              lVar7 = ref_node->old_n_global - local_40;
              ref_node->old_n_global = lVar7;
              ref_node->new_n_global = lVar7;
              free(counts_00);
              free(counts);
              return 0;
            }
            local_50 = uVar5;
            ref_node_eliminate_active_parts(uVar2,counts,chunk,(REF_INT)uVar5,&active1,&nactive);
            RVar1 = active1;
            for (lVar7 = 0; lVar7 < (int)uVar2; lVar7 = lVar7 + 1) {
              counts_00[lVar7] = 0;
            }
            lVar6 = (long)(int)local_50;
            for (lVar7 = lVar6; lVar7 < active1; lVar7 = lVar7 + 1) {
              counts_00[lVar7] = counts[lVar7];
            }
            uVar2 = 0;
            for (; lVar6 < active1; lVar6 = lVar6 + 1) {
              uVar2 = uVar2 + counts_00[lVar6];
            }
            if ((int)uVar2 < 0) break;
            sorts = (REF_GLOB *)malloc((ulong)uVar2 << 3);
            if (sorts == (REF_GLOB *)0x0) {
              pcVar11 = "malloc unused of REF_GLOB NULL";
              uVar8 = 0x2a0;
              goto LAB_0018247e;
            }
            uVar4 = ref_mpi_allgatherv(ref_mpi,ref_node->unused_global,counts_00,sorts,2);
            if (uVar4 != 0) {
              uVar5 = (ulong)uVar4;
              pcVar11 = "gather active unused";
              uVar8 = 0x2a3;
              goto LAB_00182385;
            }
            uVar4 = ref_sort_in_place_glob(uVar2,sorts);
            if (uVar4 != 0) {
              uVar5 = (ulong)uVar4;
              pcVar11 = "in place sort";
              uVar8 = 0x2a5;
              goto LAB_00182385;
            }
            if (ref_mpi->id < RVar1 && (int)local_50 <= ref_mpi->id) {
              *local_48 = 0;
            }
            ref_node_eliminate_unused_offset(ref_node->n,ref_node->sorted_global,uVar2,sorts);
            ref_node_eliminate_unused_offset(ref_node->n_unused,ref_node->unused_global,uVar2,sorts)
            ;
            free(sorts);
            uVar2 = ref_mpi->n;
            uVar5 = (ulong)(uint)RVar1;
          }
          pcVar11 = "malloc unused of REF_GLOB negative";
          uVar8 = 0x2a0;
          goto LAB_0018242f;
        }
        uVar5 = (ulong)uVar2;
        pcVar11 = "gather size";
        uVar8 = 0x283;
        goto LAB_00182385;
      }
      pcVar11 = "malloc active_counts of REF_INT NULL";
      uVar8 = 0x280;
    }
LAB_0018247e:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
           "ref_node_eliminate_unused_globals",pcVar11);
    RVar10 = 2;
  }
  else {
    uVar5 = (ulong)uVar2;
    pcVar11 = "in place";
    uVar8 = 0x27c;
LAB_00182385:
    RVar10 = (REF_STATUS)uVar5;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
           "ref_node_eliminate_unused_globals",uVar5,pcVar11);
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_node_eliminate_unused_globals(REF_NODE ref_node) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *counts, *active_counts;
  REF_GLOB *unused;
  REF_GLOB total_unused;
  REF_INT total_active;
  REF_INT part, chunk;
  REF_INT active0, active1, nactive;
  REF_INT i, local;

  /* sort so that decrement of future processed unused works */
  RSS(ref_sort_in_place_glob(ref_node_n_unused(ref_node),
                             ref_node->unused_global),
      "in place");

  /* share unused count */
  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  ref_malloc(active_counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &(ref_node_n_unused(ref_node)), counts,
                        REF_INT_TYPE),
      "gather size");
  total_unused = 0;
  each_ref_mpi_part(ref_mpi, part) total_unused += counts[part];

  /* heuristic of max to process at a time */
  chunk = (REF_INT)(total_unused / ref_mpi_n(ref_mpi) + 1);
  chunk = MAX(chunk, 100000);

  /* while have unused to process */
  active0 = 0;
  while (active0 < ref_mpi_n(ref_mpi)) {
    /* processor [active0, active1) slice of at least one and less than chunk */
    RSS(ref_node_eliminate_active_parts(ref_mpi_n(ref_mpi), counts, chunk,
                                        active0, &active1, &nactive),
        "active part range");

    /* active unused count and share active unused list, sorted */
    each_ref_mpi_part(ref_mpi, part) active_counts[part] = 0;
    for (part = active0; part < active1; part++) {
      active_counts[part] = counts[part];
    }

    /* count active unused (between active0 and active1-1) */
    total_active = 0;
    for (part = active0; part < active1; part++) {
      total_active += active_counts[part];
    }

    /* gather active unused, and sort */
    ref_malloc(unused, total_active, REF_GLOB);
    RSS(ref_mpi_allgatherv(ref_mpi, ref_node->unused_global, active_counts,
                           unused, REF_GLOB_TYPE),
        "gather active unused");
    /* (each part already sorted, merge sort faster? */
    RSS(ref_sort_in_place_glob(total_active, unused), "in place sort");

    /* erase unused gathered in active unused list */
    if (active0 <= ref_mpi_rank(ref_mpi) && ref_mpi_rank(ref_mpi) < active1)
      ref_node_n_unused(ref_node) = 0;

    /* shift ref_node sorted_globals */
    RSS(ref_node_eliminate_unused_offset(ref_node_n(ref_node),
                                         ref_node->sorted_global, total_active,
                                         unused),
        "offset sorted globals");

    /* shift unprocessed unused */
    RSS(ref_node_eliminate_unused_offset(ref_node_n_unused(ref_node),
                                         ref_node->unused_global, total_active,
                                         unused),
        "offset sorted unused");
    ref_free(unused);

    active0 = active1;
  }

  /* update node global with shifted sorted_global */
  for (i = 0; i < ref_node_n(ref_node); i++) {
    local = ref_node->sorted_local[i];
    ref_node->global[local] = ref_node->sorted_global[i];
  }

  /* set compact global count */
  RSS(ref_node_initialize_n_global(ref_node,
                                   ref_node->old_n_global - total_unused),
      "re-init");

  ref_free(active_counts);
  ref_free(counts);
  return REF_SUCCESS;
}